

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging_cfg.c
# Opt level: O3

int oonf_logcfg_apply(cfg_db *db)

{
  char *__filename;
  void *__stream;
  int iVar1;
  int iVar2;
  int iVar3;
  cfg_named_section *named;
  const_strarray *pcVar4;
  FILE *pFVar5;
  uint *puVar6;
  char *pcVar7;
  long lVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  ulong uVar11;
  bool bVar12;
  byte bVar13;
  
  bVar13 = 0;
  builtin_memcpy(_logging_cfg + 0x70,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  builtin_memcpy(_logging_cfg + 0x60,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  builtin_memcpy(_logging_cfg + 0x50,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  builtin_memcpy(_logging_cfg + 0x40,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  builtin_memcpy(_logging_cfg + 0x30,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  builtin_memcpy(_logging_cfg + 0x20,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  builtin_memcpy(_logging_cfg + 0x10,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  builtin_memcpy(_logging_cfg,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  named = cfg_db_find_namedsection(db,"log",(char *)0x0);
  if (named != (cfg_named_section *)0x0) {
    _apply_log_setting(named,"info",LOG_SEVERITY_INFO);
    _apply_log_setting(named,"debug",LOG_SEVERITY_DEBUG);
  }
  puVar9 = _logging_cfg;
  puVar10 = _syslog_handler.user_bitmask;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined8 *)puVar10 = *(undefined8 *)puVar9;
    puVar9 = puVar9 + ((ulong)bVar13 * -2 + 1) * 8;
    puVar10 = puVar10 + ((ulong)bVar13 * -2 + 1) * 8;
  }
  puVar9 = _logging_cfg;
  puVar10 = _stderr_handler.user_bitmask;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined8 *)puVar10 = *(undefined8 *)puVar9;
    puVar9 = puVar9 + ((ulong)bVar13 * -2 + 1) * 8;
    puVar10 = puVar10 + ((ulong)bVar13 * -2 + 1) * 8;
  }
  puVar9 = _logging_cfg;
  puVar10 = _file_handler.user_bitmask;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined8 *)puVar10 = *(undefined8 *)puVar9;
    puVar9 = puVar9 + ((ulong)bVar13 * -2 + 1) * 8;
    puVar10 = puVar10 + ((ulong)bVar13 * -2 + 1) * 8;
  }
  bVar12 = false;
  pcVar4 = cfg_db_get_entry_value(db,"log",(char *)0x0,"syslog");
  iVar1 = cfg_get_choice_index(pcVar4->value,cfg_get_choice_array_value,4,CFGLIST_BOOL_TRUE);
  pcVar4 = cfg_db_get_entry_value(db,"log",(char *)0x0,"file");
  __filename = pcVar4->value;
  if (__filename != (char *)0x0) {
    bVar12 = *__filename != '\0';
  }
  pcVar4 = cfg_db_get_entry_value(db,"log",(char *)0x0,"stderr");
  iVar2 = cfg_get_choice_index(pcVar4->value,cfg_get_choice_array_value,4,CFGLIST_BOOL_TRUE);
  pcVar4 = cfg_db_get_entry_value(db,"log",(char *)0x0,"stderr_color");
  iVar3 = cfg_get_choice_index(pcVar4->value,cfg_get_choice_array_value,4,CFGLIST_BOOL_TRUE);
  __stream = _file_handler.custom;
  _stderr_color = -1 < iVar3;
  if (bVar12) {
    bVar12 = true;
    if (_file_handler._node.prev == (list_entity *)0x0 ||
        _file_handler._node.next == (list_entity *)0x0) {
      pFVar5 = fopen(__filename,"w");
      if (pFVar5 == (FILE *)0x0) {
        puVar6 = (uint *)__errno_location();
        uVar11 = (ulong)*puVar6;
        goto LAB_00110263;
      }
      oonf_log_addhandler(&_file_handler);
      _file_handler.custom = pFVar5;
    }
    uVar11 = 0;
  }
  else {
    bVar12 = false;
    uVar11 = 0;
    if (_file_handler._node.prev != (list_entity *)0x0 &&
        _file_handler._node.next != (list_entity *)0x0) {
      oonf_log_removehandler(&_file_handler);
      fflush((FILE *)__stream);
      fclose((FILE *)__stream);
      uVar11 = 0;
LAB_00110263:
      bVar12 = false;
    }
  }
  if ((bool)(iVar2 < 0 & (-1 < iVar1 | bVar12))) {
    if (_stderr_handler._node.prev != (list_entity *)0x0 &&
        _stderr_handler._node.next != (list_entity *)0x0) {
      oonf_log_removehandler(&_stderr_handler);
    }
  }
  else if (_stderr_handler._node.prev == (list_entity *)0x0 ||
           _stderr_handler._node.next == (list_entity *)0x0) {
    oonf_log_addhandler(&_stderr_handler);
  }
  if (config_global.fork == true) {
    if (!bVar12 || -1 < iVar1) {
LAB_001102f6:
      if ((_syslog_handler._node.next == (list_entity *)0x0) ||
         (_syslog_handler._node.prev == (list_entity *)0x0)) {
        oonf_log_addhandler(&_syslog_handler);
      }
      goto LAB_00110316;
    }
  }
  else if (-1 < iVar1) goto LAB_001102f6;
  if ((_syslog_handler._node.next != (list_entity *)0x0) &&
     (_syslog_handler._node.prev != (list_entity *)0x0)) {
    oonf_log_removehandler(&_syslog_handler);
  }
LAB_00110316:
  oonf_log_updatemask();
  if ((int)uVar11 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    if ((log_global_mask[1] & 4) != 0) {
      pcVar7 = strerror((int)uVar11);
      iVar1 = 1;
      oonf_log(LOG_SEVERITY_WARN,LOG_MAIN,"src/libcore/oonf_logging_cfg.c",0xea,(void *)0x0,0,
               "Cannot open file \'%s\' for logging: %s (%d)",__filename,pcVar7,uVar11);
    }
  }
  return iVar1;
}

Assistant:

int
oonf_logcfg_apply(struct cfg_db *db) {
  struct cfg_named_section *named;
  const char *ptr, *file_name;
  int file_errno = 0;
  bool activate_syslog, activate_file, activate_stderr;

  /* clean up logging mask */
  oonf_log_mask_clear(_logging_cfg);

  /* now apply specific settings */
  named = cfg_db_find_namedsection(db, LOG_SECTION, NULL);
  if (named != NULL) {
    _apply_log_setting(named, LOG_INFO_ENTRY, LOG_SEVERITY_INFO);
    _apply_log_setting(named, LOG_DEBUG_ENTRY, LOG_SEVERITY_DEBUG);
  }

  oonf_log_mask_copy(_syslog_handler.user_bitmask, _logging_cfg);
  oonf_log_mask_copy(_stderr_handler.user_bitmask, _logging_cfg);
  oonf_log_mask_copy(_file_handler.user_bitmask, _logging_cfg);

  /* load settings which loggershould be activated */
  ptr = cfg_db_get_entry_value(db, LOG_SECTION, NULL, LOG_SYSLOG_ENTRY)->value;
  activate_syslog = cfg_get_bool(ptr);

  file_name = cfg_db_get_entry_value(db, LOG_SECTION, NULL, LOG_FILE_ENTRY)->value;
  activate_file = file_name != NULL && *file_name != 0;

  ptr = cfg_db_get_entry_value(db, LOG_SECTION, NULL, LOG_STDERR_ENTRY)->value;
  activate_stderr = cfg_get_bool(ptr);

  ptr = cfg_db_get_entry_value(db, LOG_SECTION, NULL, LOG_STDERR_COLOR_ENTRY)->value;
  _stderr_color = cfg_get_bool(ptr);

  /* and finally modify the logging handlers */
  /* log.file */
  if (activate_file && !list_is_node_added(&_file_handler._node)) {
    FILE *f;

    f = fopen(file_name, "w");
    if (f != NULL) {
      oonf_log_addhandler(&_file_handler);
      _file_handler.custom = f;
    }
    else {
      file_errno = errno;
      activate_file = false;
    }
  }
  else if (!activate_file && list_is_node_added(&_file_handler._node)) {
    FILE *f = _file_handler.custom;
    oonf_log_removehandler(&_file_handler);

    fflush(f);
    fclose(f);
  }

  /* log.stderr (activate if syslog and file are offline) */
  activate_stderr |= !(activate_syslog || activate_file);

  if (activate_stderr && !list_is_node_added(&_stderr_handler._node)) {
    oonf_log_addhandler(&_stderr_handler);
  }
  else if (!activate_stderr && list_is_node_added(&_stderr_handler._node)) {
    oonf_log_removehandler(&_stderr_handler);
  }

  /* log.syslog */
  if (config_global.fork) {
    activate_syslog |= !activate_file;
  }

  if (activate_syslog && !list_is_node_added(&_syslog_handler._node)) {
    oonf_log_addhandler(&_syslog_handler);
  }
  else if (!activate_syslog && list_is_node_added(&_syslog_handler._node)) {
    oonf_log_removehandler(&_syslog_handler);
  }

  /* reload logging mask */
  oonf_log_updatemask();

  if (file_errno) {
    OONF_WARN(LOG_MAIN, "Cannot open file '%s' for logging: %s (%d)", file_name, strerror(file_errno), file_errno);
    return 1;
  }

  return 0;
}